

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmMakefile *mf;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var4;
  size_t sVar5;
  ostream *poVar6;
  cmGeneratorTarget *this_00;
  string *psVar7;
  cmValue cVar8;
  WrapQuotes wrapQuotes;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  pointer pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar10;
  pointer pbVar11;
  string_view arg_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string emulatorExe;
  string exe;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  string local_b0;
  string equalSigns;
  cmGeneratorExpression ge;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_60;
  string local_50 [32];
  
  this->TestGenerated = true;
  p_Var4 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            *)cmTest::GetBacktrace(this->Test);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_60,p_Var4);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  mf = this->Test->Makefile;
  std::__cxx11::string::string((string *)&equalSigns,(string *)&this->Test->Name);
  bVar1 = anon_unknown.dwarf_6d71ca::needToQuoteTestName(mf,&equalSigns);
  std::__cxx11::string::~string((string *)&equalSigns);
  std::__cxx11::string::string((string *)&exe,(string *)&this->Test->Name);
  sVar5 = anon_unknown.dwarf_6d71ca::countMaxConsecutiveEqualSigns(&exe);
  equalSigns._M_dataplus._M_p = (pointer)&equalSigns.field_2;
  std::__cxx11::string::_M_construct((ulong)&equalSigns,(char)sVar5 + '\x01');
  std::__cxx11::string::~string((string *)&exe);
  if (bVar1) {
    poVar6 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar6 = std::operator<<(poVar6,"add_test([");
    poVar6 = std::operator<<(poVar6,(string *)&equalSigns);
    poVar6 = std::operator<<(poVar6,"[");
    std::__cxx11::string::string((string *)&exe,(string *)&this->Test->Name);
    poVar6 = std::operator<<(poVar6,(string *)&exe);
    poVar6 = std::operator<<(poVar6,"]");
    poVar6 = std::operator<<(poVar6,(string *)&equalSigns);
    std::operator<<(poVar6,"] ");
  }
  else {
    poVar6 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar6 = std::operator<<(poVar6,"add_test(");
    std::__cxx11::string::string((string *)&exe,(string *)&this->Test->Name);
    poVar6 = std::operator<<(poVar6,(string *)&exe);
    std::operator<<(poVar6," ");
  }
  std::__cxx11::string::~string((string *)&exe);
  psVar7 = config;
  EvaluateCommandLineArguments(&argv,this,&this->Test->Command,&ge,config);
  bVar2 = cmTest::GetCommandExpandLists(this->Test);
  if (bVar2) {
    cmExpandedLists<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&exe,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )argv.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )argv.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&argv,&exe);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&exe);
    if (argv.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        argv.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&argv);
    }
  }
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             argv.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,&exe);
  if (this_00 != (cmGeneratorTarget *)0x0) {
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (TVar3 == EXECUTABLE) {
      psVar7 = (string *)0x0;
      cmGeneratorTarget::GetFullPath(&emulatorExe,this_00,config,RuntimeBinaryArtifact,false);
      std::__cxx11::string::operator=((string *)&exe,(string *)&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&emulatorExe,"CROSSCOMPILING_EMULATOR",(allocator<char> *)&local_b0);
      cVar8 = cmGeneratorTarget::GetProperty(this_00,&emulatorExe);
      std::__cxx11::string::~string((string *)&emulatorExe);
      if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
        arg_00._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
        arg_00._M_len = (cVar8.Value)->_M_string_length;
        cmExpandedList_abi_cxx11_(&emulatorWithArgs,arg_00,false);
        std::__cxx11::string::string
                  ((string *)&emulatorExe,
                   (string *)
                   emulatorWithArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        cmsys::SystemTools::ConvertToUnixSlashes(&emulatorExe);
        str_02._M_str = (char *)0x0;
        str_02._M_len = (size_t)emulatorExe._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_b0,(cmOutputConverter *)emulatorExe._M_string_length,str_02,
                   (WrapQuotes)psVar7);
        poVar6 = std::operator<<(os,(string *)&local_b0);
        std::operator<<(poVar6," ");
        std::__cxx11::string::~string((string *)&local_b0);
        pbVar10 = emulatorWithArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar9 = emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (pbVar11 = pbVar9 + 1, pbVar11 != pbVar10) {
          str_03._M_str = (char *)0x0;
          str_03._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    (&local_b0,(cmOutputConverter *)pbVar9[1]._M_string_length,str_03,
                     (WrapQuotes)psVar7);
          poVar6 = std::operator<<(os,(string *)&local_b0);
          std::operator<<(poVar6," ");
          std::__cxx11::string::~string((string *)&local_b0);
          pbVar9 = pbVar11;
        }
        std::__cxx11::string::~string((string *)&emulatorExe);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&emulatorWithArgs);
      }
      goto LAB_0023cf44;
    }
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
LAB_0023cf44:
  str._M_str = (char *)0x0;
  str._M_len = (size_t)exe._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            (&emulatorExe,(cmOutputConverter *)exe._M_string_length,str,(WrapQuotes)psVar7);
  std::operator<<(os,(string *)&emulatorExe);
  std::__cxx11::string::~string((string *)&emulatorExe);
  pbVar9 = argv.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar10 = pbVar9 + 1,
        pbVar10 !=
        argv.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    poVar6 = std::operator<<(os," ");
    str_00._M_str = (char *)0x0;
    str_00._M_len = (size_t)(pbVar10->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&emulatorExe,(cmOutputConverter *)pbVar9[1]._M_string_length,str_00,
               (WrapQuotes)psVar7);
    std::operator<<(poVar6,(string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    pbVar9 = pbVar10;
  }
  std::operator<<(os,")\n");
  if (bVar1) {
    poVar6 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar6 = std::operator<<(poVar6,"set_tests_properties([");
    poVar6 = std::operator<<(poVar6,(string *)&equalSigns);
    poVar6 = std::operator<<(poVar6,"[");
    std::__cxx11::string::string((string *)&emulatorExe,(string *)&this->Test->Name);
    poVar6 = std::operator<<(poVar6,(string *)&emulatorExe);
    poVar6 = std::operator<<(poVar6,"]");
    poVar6 = std::operator<<(poVar6,(string *)&equalSigns);
    std::operator<<(poVar6,"] PROPERTIES ");
  }
  else {
    poVar6 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar6 = std::operator<<(poVar6,"set_tests_properties(");
    std::__cxx11::string::string((string *)&emulatorExe,(string *)&this->Test->Name);
    poVar6 = std::operator<<(poVar6,(string *)&emulatorExe);
    std::operator<<(poVar6," PROPERTIES ");
  }
  std::__cxx11::string::~string((string *)&emulatorExe);
  cmPropertyMap::GetList_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&emulatorWithArgs,&this->Test->Properties);
  for (pbVar9 = emulatorWithArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != emulatorWithArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 2) {
    poVar6 = std::operator<<(os," ");
    poVar6 = std::operator<<(poVar6,(string *)pbVar9);
    poVar6 = std::operator<<(poVar6," ");
    std::__cxx11::string::string(local_50,(string *)(pbVar9 + 1));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e8,(string *)&ge);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    wrapQuotes = Wrap;
    psVar7 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_e8,this->LG,config,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (cmGeneratorTarget *)0x0,&local_b0);
    str_01._M_str = (char *)0x0;
    str_01._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&emulatorExe,(cmOutputConverter *)psVar7->_M_string_length,str_01,wrapQuotes);
    std::operator<<(poVar6,(string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&emulatorExe);
    std::__cxx11::string::~string((string *)&local_b0);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_e8);
    std::__cxx11::string::~string(local_50);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&emulatorWithArgs);
  GenerateInternalProperties(this,os);
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&exe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argv);
  std::__cxx11::string::~string((string *)&equalSigns);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(this->Test->GetBacktrace());

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Start the test command.
  if (quote_test_name) {
    os << indent << "add_test([" << equalSigns << "[" << this->Test->GetName()
       << "]" << equalSigns << "] ";
  } else {
    os << indent << "add_test(" << this->Test->GetName() << " ";
  }

  // Evaluate command line arguments
  std::vector<std::string> argv =
    this->EvaluateCommandLineArguments(this->Test->GetCommand(), ge, config);

  // Expand arguments if COMMAND_EXPAND_LISTS is set
  if (this->Test->GetCommandExpandLists()) {
    argv = cmExpandedLists(argv.begin(), argv.end());
    // Expanding lists on an empty command may have left it empty
    if (argv.empty()) {
      argv.emplace_back();
    }
  }

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = argv[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    cmValue emulator = target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (cmNonempty(emulator)) {
      std::vector<std::string> emulatorWithArgs = cmExpandedList(*emulator);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for (std::string const& arg : cmMakeRange(emulatorWithArgs).advance(1)) {
        os << cmOutputConverter::EscapeForCMake(arg) << " ";
      }
    }
  } else {
    // Use the command name given.
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);

  for (auto const& arg : cmMakeRange(argv).advance(1)) {
    os << " " << cmOutputConverter::EscapeForCMake(arg);
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    os << indent << "set_tests_properties([" << equalSigns << "["
       << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second)->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")\n";
}